

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryEffectsLoader15.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL::LibraryEffectsLoader15::data__wrap_s____fx_sampler_wrap_enum
          (LibraryEffectsLoader15 *this,ENUM__fx_sampler_wrap_enum value)

{
  byte bVar1;
  undefined4 in_ESI;
  long in_RDI;
  ENUM__fx_sampler_wrap_common newValue;
  undefined4 local_10;
  
  switch(in_ESI) {
  case 0:
    local_10 = 1;
    break;
  case 1:
    local_10 = 4;
    break;
  case 2:
    local_10 = 5;
    break;
  case 3:
    local_10 = 2;
    break;
  case 4:
    local_10 = 3;
    break;
  case 5:
    local_10 = 6;
    break;
  case 6:
    local_10 = 7;
  }
  bVar1 = (**(code **)(**(long **)(in_RDI + 0x20) + 0x178))(*(long **)(in_RDI + 0x20),local_10);
  return (bool)(bVar1 & 1);
}

Assistant:

bool LibraryEffectsLoader15::data__wrap_s____fx_sampler_wrap_enum( const COLLADASaxFWL15::ENUM__fx_sampler_wrap_enum value )
{
SaxVirtualFunctionTest15(data__wrap_s____fx_sampler_wrap_enum(value));
COLLADASaxFWL::ENUM__fx_sampler_wrap_common newValue;
switch (value) {
case COLLADASaxFWL15::ENUM__fx_sampler_wrap_enum__WRAP: newValue=COLLADASaxFWL::ENUM__fx_sampler_wrap_common__WRAP; break;
case COLLADASaxFWL15::ENUM__fx_sampler_wrap_enum__CLAMP: newValue=COLLADASaxFWL::ENUM__fx_sampler_wrap_common__CLAMP; break;
case COLLADASaxFWL15::ENUM__fx_sampler_wrap_enum__BORDER: newValue=COLLADASaxFWL::ENUM__fx_sampler_wrap_common__BORDER; break;
case COLLADASaxFWL15::ENUM__fx_sampler_wrap_enum__MIRROR: newValue=COLLADASaxFWL::ENUM__fx_sampler_wrap_common__MIRROR; break;
case COLLADASaxFWL15::ENUM__fx_sampler_wrap_enum__MIRROR_ONCE: newValue=COLLADASaxFWL::ENUM__fx_sampler_wrap_common__MIRROR_ONCE; break;
case COLLADASaxFWL15::ENUM__fx_sampler_wrap_enum__COUNT: newValue=COLLADASaxFWL::ENUM__fx_sampler_wrap_common__COUNT; break;
case COLLADASaxFWL15::ENUM__fx_sampler_wrap_enum__NOT_PRESENT: newValue=COLLADASaxFWL::ENUM__fx_sampler_wrap_common__NOT_PRESENT; break;
}
return mLoader->data__wrap_s____fx_sampler_wrap_common(newValue);
}